

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Path * __thiscall kj::Path::eval(Path *__return_storage_ptr__,Path *this,StringPtr pathText)

{
  RemoveConst<kj::String> *pRVar1;
  char *pcVar2;
  Vector<kj::String> *parts;
  String *pSVar3;
  size_t sVar4;
  size_t sVar5;
  String *p;
  long lVar6;
  String *pSVar7;
  StringPtr path;
  StringPtr path_00;
  Vector<kj::String> newParts;
  Vector<kj::String> local_68;
  char *local_40;
  Path *local_38;
  
  path_00.content.ptr = (char *)pathText.content.size_;
  parts = (Vector<kj::String> *)pathText.content.ptr;
  if ((path_00.content.ptr == (char *)0x1) || (*(char *)&(parts->builder).ptr != '/')) {
    if ((Vector<kj::String> *)(path_00.content.ptr + (long)((long)&parts[-1].builder.disposer + 7))
        == parts) {
      lVar6 = 1;
    }
    else {
      lVar6 = 1;
      pcVar2 = (char *)0x0;
      do {
        lVar6 = lVar6 + (ulong)(pcVar2[(long)&parts->builder] == '/');
        pcVar2 = pcVar2 + 1;
      } while (path_00.content.ptr + -1 != pcVar2);
    }
    sVar5 = lVar6 + (this->parts).size_;
    sVar4 = 0;
    local_40 = path_00.content.ptr;
    local_38 = __return_storage_ptr__;
    local_68.builder.pos =
         (RemoveConst<kj::String> *)
         kj::_::HeapArrayDisposer::allocateImpl
                   (0x18,0,sVar5,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    local_68.builder.endPtr = local_68.builder.pos + sVar5;
    local_68.builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    sVar5 = (this->parts).size_;
    local_68.builder.ptr = local_68.builder.pos;
    if (sVar5 != 0) {
      pSVar7 = (this->parts).ptr;
      pSVar3 = pSVar7 + sVar5;
      do {
        if (local_68.builder.pos == local_68.builder.endPtr) {
          sVar5 = ((long)local_68.builder.pos - (long)local_68.builder.ptr >> 3) *
                  0x5555555555555556;
          if (local_68.builder.pos == local_68.builder.ptr) {
            sVar5 = 4;
          }
          Vector<kj::String>::setCapacity(&local_68,sVar5);
        }
        ((local_68.builder.pos)->content).ptr = (pSVar7->content).ptr;
        ((local_68.builder.pos)->content).size_ = (pSVar7->content).size_;
        ((local_68.builder.pos)->content).disposer = (pSVar7->content).disposer;
        (pSVar7->content).ptr = (char *)0x0;
        (pSVar7->content).size_ = 0;
        local_68.builder.pos = local_68.builder.pos + 1;
        pSVar7 = pSVar7 + 1;
      } while (pSVar7 != pSVar3);
    }
    __return_storage_ptr__ = local_38;
    path.content.size_ = sVar4;
    path.content.ptr = local_40;
    evalImpl(local_38,(Path *)&local_68,parts,path);
  }
  else {
    if ((Vector<kj::String> *)(path_00.content.ptr + (long)((long)&parts[-1].builder.disposer + 7))
        == parts) {
      sVar5 = 1;
    }
    else {
      sVar5 = 1;
      pcVar2 = (char *)0x0;
      do {
        sVar5 = sVar5 + (pcVar2[(long)&parts->builder] == '/');
        pcVar2 = pcVar2 + 1;
      } while (path_00.content.ptr + -1 != pcVar2);
    }
    sVar4 = 0;
    local_68.builder.ptr =
         (String *)
         kj::_::HeapArrayDisposer::allocateImpl
                   (0x18,0,sVar5,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    local_68.builder.endPtr = local_68.builder.ptr + sVar5;
    local_68.builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    path_00.content.size_ = sVar4;
    local_68.builder.pos = local_68.builder.ptr;
    evalImpl(__return_storage_ptr__,(Path *)&local_68,parts,path_00);
  }
  pSVar3 = local_68.builder.endPtr;
  pRVar1 = local_68.builder.pos;
  pSVar7 = local_68.builder.ptr;
  if (local_68.builder.ptr != (String *)0x0) {
    local_68.builder.ptr = (String *)0x0;
    local_68.builder.pos = (RemoveConst<kj::String> *)0x0;
    local_68.builder.endPtr = (String *)0x0;
    (**(local_68.builder.disposer)->_vptr_ArrayDisposer)
              (local_68.builder.disposer,pSVar7,0x18,
               ((long)pRVar1 - (long)pSVar7 >> 3) * -0x5555555555555555,
               ((long)pSVar3 - (long)pSVar7 >> 3) * -0x5555555555555555,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  return __return_storage_ptr__;
}

Assistant:

Path Path::eval(StringPtr pathText) && {
  if (pathText.startsWith("/")) {
    // Optimization: avoid copying parts that will just be dropped.
    return evalImpl(Vector<String>(countParts(pathText)), pathText);
  } else {
    Vector<String> newParts(parts.size() + countParts(pathText));
    for (auto& p: parts) newParts.add(kj::mv(p));
    return evalImpl(kj::mv(newParts), pathText);
  }
}